

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_find_header_fup(pt_packet *packet,pt_packet_decoder *pacdec)

{
  pt_packet_type pVar1;
  int iVar2;
  undefined1 local_148 [4];
  int errcode;
  pt_packet_decoder decoder;
  pt_packet_decoder *pacdec_local;
  pt_packet *packet_local;
  
  if ((packet == (pt_packet *)0x0) || (pacdec == (pt_packet_decoder *)0x0)) {
    packet_local._4_4_ = -1;
  }
  else {
    decoder.sync = (uint8_t *)pacdec;
    memcpy(local_148,pacdec,0x128);
    do {
      do {
        do {
          iVar2 = pt_pkt_next((pt_packet_decoder *)local_148,packet,0x18);
          if (iVar2 < 0) {
            return iVar2;
          }
          pVar1 = packet->type;
        } while ((pVar1 == ppt_invalid) || (pVar1 == ppt_pad));
        if (pVar1 == ppt_psbend) {
          return 0;
        }
        if (pVar1 == ppt_fup) {
          return 1;
        }
      } while (pVar1 - ppt_mode < 8);
      if (pVar1 == ppt_ovf) {
        return 0;
      }
    } while (pVar1 == ppt_mnt);
    packet_local._4_4_ = -6;
  }
  return packet_local._4_4_;
}

Assistant:

static int pt_evt_find_header_fup(struct pt_packet *packet,
				  const struct pt_packet_decoder *pacdec)
{
	struct pt_packet_decoder decoder;

	if (!packet || !pacdec)
		return -pte_internal;

	decoder = *pacdec;
	for (;;) {
		int errcode;

		errcode = pt_pkt_next(&decoder, packet, sizeof(*packet));
		if (errcode < 0)
			return errcode;

		switch (packet->type) {
		case ppt_fup:
			/* Found it. */
			return 1;

		case ppt_mode:
		case ppt_pip:
		case ppt_vmcs:
		case ppt_mnt:
		case ppt_tsc:
		case ppt_cbr:
		case ppt_tma:
		case ppt_mtc:
		case ppt_cyc:
		case ppt_pad:
		case ppt_invalid:
			/* Ignore the packet. */
			break;

		case ppt_psbend:
		case ppt_ovf:
			/* There's no FUP in here. */
			return 0;

		default:
			return -pte_bad_context;
		}
	}
}